

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O0

void compact_suite::test_float64(void)

{
  size_type sVar1;
  view_type *pvVar2;
  const_iterator pvVar3;
  const_iterator pvVar4;
  pointer output;
  size_type output_length;
  iterator pvVar5;
  iterator pvVar6;
  const_iterator pvVar7;
  const_iterator pvVar8;
  UI_STRING *uis;
  char *ui;
  size_type local_150;
  size_type local_148 [2];
  undefined1 auStack_138 [8];
  array<double,_3UL> buffer;
  undefined1 auStack_118 [8];
  array<double,_3UL> expected;
  undefined8 uStack_f8;
  value_type expected_literal [24];
  undefined4 local_d4;
  value local_d0 [2];
  undefined4 local_c8;
  value local_c4 [6];
  undefined4 local_ac;
  value local_a8 [2];
  undefined1 local_a0 [8];
  reader reader;
  value_type input [26];
  
  reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x18af;
  trial::protocol::bintoken::reader::reader<unsigned_char[26]>
            ((reader *)local_a0,
             (uchar (*) [26])
             ((long)&reader.stack.c.
                     super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  local_a8[0] = trial::protocol::bintoken::reader::code((reader *)local_a0);
  local_ac = 0xaf;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::array8_float64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x476,"void compact_suite::test_float64()",local_a8,&local_ac);
  local_c4[0] = trial::protocol::bintoken::reader::symbol((reader *)local_a0);
  local_c8 = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("reader.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x477,"void compact_suite::test_float64()",local_c4,&local_c8);
  local_d0[0] = trial::protocol::bintoken::reader::category((reader *)local_a0);
  local_d4 = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x478,"void compact_suite::test_float64()",local_d0,&local_d4);
  sVar1 = trial::protocol::bintoken::reader::length((reader *)local_a0);
  boost::detail::test_impl
            ("reader.length() == 3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x479,"void compact_suite::test_float64()",sVar1 == 3);
  uStack_f8 = 0x3ff0000000000000;
  expected_literal[0] = '\0';
  expected_literal[1] = '\0';
  expected_literal[2] = '\0';
  expected_literal[3] = '\0';
  expected_literal[4] = '\0';
  expected_literal[5] = '\0';
  expected_literal[6] = '\0';
  expected_literal[7] = '@';
  expected_literal[8] = '\0';
  expected_literal[9] = '\0';
  expected_literal[10] = '\0';
  expected_literal[0xb] = '\0';
  expected_literal[0xc] = '\0';
  expected_literal[0xd] = '\0';
  expected_literal[0xe] = '\b';
  expected_literal[0xf] = '@';
  pvVar2 = trial::protocol::bintoken::reader::literal((reader *)local_a0);
  pvVar3 = std::
           basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
           ::begin(pvVar2);
  pvVar2 = trial::protocol::bintoken::reader::literal((reader *)local_a0);
  pvVar4 = std::
           basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
           ::end(pvVar2);
  boost::detail::
  test_all_with_impl<std::ostream,unsigned_char_const*,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x481,"void compact_suite::test_float64()",pvVar3,pvVar4,&uStack_f8,
             expected_literal + 0x10);
  auStack_118 = (undefined1  [8])0x3ff0000000000000;
  expected._M_elems[0] = 2.0;
  expected._M_elems[1] = 3.0;
  auStack_138 = (undefined1  [8])0x0;
  buffer._M_elems[0] = 0.0;
  buffer._M_elems[1] = 0.0;
  output = std::array<double,_3UL>::data((array<double,_3UL> *)auStack_138);
  output_length = std::array<double,_3UL>::size((array<double,_3UL> *)auStack_138);
  local_148[0] = trial::protocol::bintoken::reader::array<double>
                           ((reader *)local_a0,output,output_length);
  local_150 = std::array<double,_3UL>::size((array<double,_3UL> *)auStack_138);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,unsigned_long>
            ("reader.array<token::float64::type>(buffer.data(), buffer.size())","buffer.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x489,"void compact_suite::test_float64()",local_148,&local_150);
  pvVar5 = std::array<double,_3UL>::begin((array<double,_3UL> *)auStack_138);
  pvVar6 = std::array<double,_3UL>::end((array<double,_3UL> *)auStack_138);
  pvVar7 = std::array<double,_3UL>::begin((array<double,_3UL> *)auStack_118);
  pvVar8 = std::array<double,_3UL>::end((array<double,_3UL> *)auStack_118);
  ui = 
  "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp";
  boost::detail::test_all_with_impl<std::ostream,double*,double_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x48c,"void compact_suite::test_float64()",pvVar5,pvVar6,pvVar7,pvVar8);
  trial::protocol::bintoken::reader::~reader((reader *)local_a0,(UI *)ui,uis);
  return;
}

Assistant:

void test_float64()
{
    const value_type input[] = {
        token::code::array8_float64, 3 * token::float64::size,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0x3F,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x40,
        0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x08, 0x40 };
    format::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::array8_float64);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST(reader.length() == 3);
    {
        const value_type expected_literal[] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0x3F,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x40,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x08, 0x40 };
        TRIAL_PROTOCOL_TEST_ALL_WITH(reader.literal().begin(), reader.literal().end(),
                                     expected_literal, expected_literal + sizeof(expected_literal),
                                     std::equal_to<value_type>());
    }
    {
        const std::array<token::float64::type, 3> expected = {{
                1.0,
                2.0,
                3.0 }};
        std::array<token::float64::type, expected.size()> buffer = {};
        TRIAL_PROTOCOL_TEST_EQUAL(reader.array<token::float64::type>(buffer.data(), buffer.size()), buffer.size());
        TRIAL_PROTOCOL_TEST_ALL_WITH(buffer.begin(), buffer.end(),
                                     expected.begin(), expected.end(),
                                     std::equal_to<value_type>());
    }
}